

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O1

void __thiscall
Js::DiagInterpreterStackFrame::DiagInterpreterStackFrame
          (DiagInterpreterStackFrame *this,InterpreterStackFrame *frame)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  (this->super_DiagStackFrame).isTopFrame = false;
  (this->super_DiagStackFrame)._vptr_DiagStackFrame = (_func_int **)&PTR__DiagStackFrame_014fa568;
  this->m_interpreterFrame = frame;
  if (frame == (InterpreterStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x19b,"(m_interpreterFrame != __null)","m_interpreterFrame != NULL"
                               );
    if (!bVar2) goto LAB_008d4a1b;
    *puVar3 = 0;
  }
  if ((*(ScriptContext **)(this->m_interpreterFrame + 0x78) != (ScriptContext *)0x0) &&
     (bVar2 = ScriptContext::IsScriptContextInDebugMode
                        (*(ScriptContext **)(this->m_interpreterFrame + 0x78)), bVar2)) {
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                              ,0x19d,
                              "(m_interpreterFrame->GetScriptContext() && m_interpreterFrame->GetScriptContext()->IsScriptContextInDebugMode())"
                              ,"This only supports interpreter stack frames running in debug mode.")
  ;
  if (bVar2) {
    *puVar3 = 0;
    return;
  }
LAB_008d4a1b:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

DiagInterpreterStackFrame::DiagInterpreterStackFrame(InterpreterStackFrame* frame) :
        m_interpreterFrame(frame)
    {
        Assert(m_interpreterFrame != NULL);
        AssertMsg(m_interpreterFrame->GetScriptContext() && m_interpreterFrame->GetScriptContext()->IsScriptContextInDebugMode(),
            "This only supports interpreter stack frames running in debug mode.");
    }